

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::CAPIRulesVector::CAPIRulesVector
          (CAPIRulesVector *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  long lVar1;
  pointer ppRVar2;
  CAPIBuildKey *this_00;
  allocator_type *in_RDX;
  long lVar3;
  BuildKey key;
  BuildKey local_50;
  
  std::
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  ::vector(&this->rules,
           (long)(items->
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(items->
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,in_RDX);
  ppRVar2 = (items->
            super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar2 !=
      (items->super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = 0;
    do {
      llbuild::buildsystem::BuildKey::fromData
                (&local_50,(KeyType *)(*(long *)((long)ppRVar2 + lVar3) + 8));
      this_00 = (CAPIBuildKey *)operator_new(0x38);
      CAPIBuildKey::CAPIBuildKey(this_00,&local_50);
      *(CAPIBuildKey **)
       ((long)(this->rules).
              super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar3) = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
        operator_delete(local_50.key.key._M_dataplus._M_p,
                        local_50.key.key.field_2._M_allocated_capacity + 1);
      }
      lVar1 = lVar3 + 8;
      lVar3 = lVar3 + 8;
    } while ((pointer)(lVar1 + (long)ppRVar2) !=
             (items->
             super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

CAPIRulesVector(const std::vector<core::Rule*>& items) : rules(items.size()) {
      int idx = 0;

      for (std::vector<core::Rule*>::const_iterator it = items.begin(); it != items.end(); ++it) {
        core::Rule* rule = *it;
        auto key = BuildKey::fromData(rule->key);
        rules[idx++] = new CAPIBuildKey(key);
      }
    }